

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

char * cppcms_capi_session_get_csrf_token(cppcms_capi_session *session)

{
  char *pcVar1;
  string local_30;
  
  if (session == (cppcms_capi_session *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    cppcms_capi_session::check_loaded(session);
    cppcms::session_interface::get_csrf_token_abi_cxx11_(&local_30,(session->p).ptr_);
    std::__cxx11::string::operator=((string *)&session->returned_value,(string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    pcVar1 = (session->returned_value)._M_dataplus._M_p;
  }
  return pcVar1;
}

Assistant:

char const *cppcms_capi_session_get_csrf_token(cppcms_capi_session *session)
{
	TRY {
		if(!session)
			return 0;
		session->check_loaded();
		session->returned_value = session->p->get_csrf_token();
		return session->returned_value.c_str();
	}